

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

bool __thiscall
ByteCodeGenerator::NeedCheckBlockVar
          (ByteCodeGenerator *this,Symbol *sym,Scope *scope,FuncInfo *funcInfo)

{
  ParseNodeVar *pPVar1;
  undefined1 uVar2;
  
  if (((sym->field_0x42 & 2) == 0) ||
     ((uVar2 = 1, scope->func == funcInfo &&
      (((sym->decl->nop & ~knopName) != knopConstDecl ||
       (pPVar1 = ParseNode::AsParseNodeVar(sym->decl), pPVar1->isSwitchStmtDecl == '\0')))))) {
    uVar2 = sym->isNonSimpleParameter;
  }
  return (bool)uVar2;
}

Assistant:

bool ByteCodeGenerator::NeedCheckBlockVar(Symbol* sym, Scope* scope, FuncInfo* funcInfo) const
{
    bool tdz = sym->GetIsBlockVar()
        && (scope->GetFunc() != funcInfo || ((sym->GetDecl()->nop == knopLetDecl || sym->GetDecl()->nop == knopConstDecl) && sym->GetDecl()->AsParseNodeVar()->isSwitchStmtDecl));

    return tdz || sym->GetIsNonSimpleParameter();
}